

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

QStringList * __thiscall
QCommandLineParserPrivate::aliases(QCommandLineParserPrivate *this,QString *optionName)

{
  long lVar1;
  bool bVar2;
  QList<QCommandLineOption> *this_00;
  long in_RSI;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  const_iterator it;
  QString *in_stack_ffffffffffffff78;
  const_iterator *in_stack_ffffffffffffff80;
  QStringList *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  QHash<QString,_long_long>::constFind
            ((QHash<QString,_long_long> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  QHash<QString,_long_long>::cend((QHash<QString,_long_long> *)this_01);
  bVar2 = QHash<QString,_long_long>::const_iterator::operator==
                    ((const_iterator *)this_01,in_stack_ffffffffffffff80);
  if (bVar2) {
    memset(this_01,0,0x18);
    QList<QString>::QList((QList<QString> *)0x1f8ef8);
  }
  else {
    this_00 = (QList<QCommandLineOption> *)(in_RSI + 0x18);
    QHash<QString,_long_long>::const_iterator::operator*((const_iterator *)0x1f8f12);
    QList<QCommandLineOption>::at(this_00,(qsizetype)in_stack_ffffffffffffff78);
    QCommandLineOption::names((QCommandLineOption *)this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QStringList QCommandLineParserPrivate::aliases(const QString &optionName) const
{
    const NameHash_t::const_iterator it = nameHash.constFind(optionName);
    if (it == nameHash.cend()) {
        qWarning("QCommandLineParser: option not defined: \"%ls\"", qUtf16Printable(optionName));
        return QStringList();
    }
    return commandLineOptionList.at(*it).names();
}